

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void * vrna_realloc(void *p,uint size)

{
  int *piVar1;
  uint size_local;
  void *p_local;
  
  if (p == (void *)0x0) {
    p_local = vrna_alloc(size);
  }
  else {
    p_local = realloc(p,(ulong)size);
    if (p_local == (void *)0x0) {
      piVar1 = __errno_location();
      if (*piVar1 == 0x16) {
        fprintf(_stderr,"vrna_realloc: requested size: %d\n",(ulong)size);
        vrna_message_error("vrna_realloc allocation failure -> EINVAL");
      }
      piVar1 = __errno_location();
      if (*piVar1 == 0xc) {
        vrna_message_error("vrna_realloc allocation failure -> no memory");
      }
    }
  }
  return p_local;
}

Assistant:

PUBLIC void *
vrna_realloc(void     *p,
             unsigned size)
{
  if (p == NULL)
    return vrna_alloc(size);

  p = (void *)realloc(p, size);
  if (p == NULL) {
#ifdef EINVAL
    if (errno == EINVAL) {
      fprintf(stderr, "vrna_realloc: requested size: %d\n", size);
      vrna_message_error("vrna_realloc allocation failure -> EINVAL");
    }

    if (errno == ENOMEM)
#endif
    vrna_message_error("vrna_realloc allocation failure -> no memory");
  }

  return p;
}